

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O0

vm_obj_id_t __thiscall CVmTimeZone::get_history_list(CVmTimeZone *this)

{
  vm_obj_id_t vVar1;
  vm_val_t *this_00;
  CVmObjList *in_RDI;
  int i;
  vmtz_trans *t;
  vm_val_t ele;
  vmtz_trans t_pre;
  CVmObjList *lst;
  vm_obj_id_t lstid;
  size_t in_stack_ffffffffffffffa8;
  int local_44;
  anon_union_8_8_cb74652f_for_val in_stack_ffffffffffffffd0;
  vmtz_trans local_28;
  CVmObject *local_18;
  vm_obj_id_t local_c;
  
  local_c = CVmObjList::create((int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffa8);
  this_00 = CVmStack::push();
  vm_val_t::set_obj(this_00,local_c);
  local_18 = vm_objp(0);
  CVmObjList::cons_clear(in_RDI);
  vmtz_trans::vmtz_trans
            (&local_28,-0x80000000,-0x80000000,
             (vmtz_ttype *)in_RDI[2].super_CVmObjCollection.super_CVmObject.ext_);
  vVar1 = vmtz_trans::get_as_list(in_stack_ffffffffffffffd0);
  vm_val_t::set_obj((vm_val_t *)&stack0xffffffffffffffc8,vVar1);
  CVmObjList::cons_set_element(in_RDI,in_stack_ffffffffffffffa8,(vm_val_t *)0x350483);
  for (local_44 = 1;
      local_44 <= *(int *)&in_RDI[1].super_CVmObjCollection.super_CVmObject._vptr_CVmObject;
      local_44 = local_44 + 1) {
    vVar1 = vmtz_trans::get_as_list(in_stack_ffffffffffffffd0);
    vm_val_t::set_obj((vm_val_t *)&stack0xffffffffffffffc8,vVar1);
    CVmObjList::cons_set_element(in_RDI,in_stack_ffffffffffffffa8,(vm_val_t *)0x3504d1);
  }
  CVmStack::discard(1);
  return local_c;
}

Assistant:

vm_obj_id_t CVmTimeZone::get_history_list(VMG0_) const
{
    /* allocate the result list; stack it for gc protection */
    vm_obj_id_t lstid = CVmObjList::create(vmg_ FALSE, trans_cnt_ + 1);
    G_stk->push()->set_obj(lstid);
    CVmObjList *lst = (CVmObjList *)vm_objp(vmg_ lstid);
    lst->cons_clear();

    /* set the special first item for the pre-establishment settings */
    vmtz_trans t_pre(INT32MINVAL, INT32MINVAL, &ttype_[0]);
    vm_val_t ele;
    ele.set_obj(t_pre.get_as_list(vmg0_));
    lst->cons_set_element(0, &ele);

    /* run through the transitions */
    vmtz_trans *t = trans_;
    for (int i = 1 ; i <= trans_cnt_ ; ++i, ++t)
    {
        /* add this transition to the list */
        ele.set_obj(t->get_as_list(vmg0_));
        lst->cons_set_element(i, &ele);
    }
    
    /* discard the gc protection and return the result list */
    G_stk->discard(1);
    return lstid;
}